

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

void OpenTapFile(path *tapename,int flagbyte)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  byte tap_data [3];
  long *local_38 [2];
  long local_28 [2];
  
  CloseTapFile();
  FP_tapout = SJ_fopen(tapename,"r+b");
  if ((FILE *)FP_tapout == (FILE *)0x0) {
    pcVar1 = (tapename->_M_pathname)._M_dataplus._M_p;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,pcVar1,pcVar1 + (tapename->_M_pathname)._M_string_length);
    Error("opening file for write",(char *)local_38[0],PASS3);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  else {
    iVar2 = fseek((FILE *)FP_tapout,0,2);
    if (iVar2 != 0) {
      pcVar1 = (tapename->_M_pathname)._M_dataplus._M_p;
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,pcVar1,pcVar1 + (tapename->_M_pathname)._M_string_length);
      Error("File seek end error in TAPOUT",(char *)local_38[0],FATAL);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
    }
    lVar3 = ftell((FILE *)FP_tapout);
    tape_seek = (int)lVar3;
    tape_length = 2;
    local_38[0] = (long *)((ulong)CONCAT51(local_38[0]._3_5_,(char)flagbyte) << 0x10);
    tape_parity = flagbyte;
    sVar4 = fwrite(local_38,1,3,(FILE *)FP_tapout);
    if (sVar4 != 3) {
      fclose((FILE *)FP_tapout);
      Error("Write error (disk full?)",(char *)0x0,FATAL);
    }
  }
  return;
}

Assistant:

void OpenTapFile(const std::filesystem::path & tapename, int flagbyte)
{
	CloseTapFile();

	if (!FOPEN_ISOK(FP_tapout,tapename, "r+b")) {
		Error( "opening file for write", tapename.string().c_str());
		return;
	}
	if (fseek(FP_tapout, 0, SEEK_END)) Error("File seek end error in TAPOUT", tapename.string().c_str(), FATAL);

	tape_seek = ftell(FP_tapout);
	tape_parity = flagbyte;
	tape_length = 2;

	byte tap_data[3] = { 0, 0, (byte)flagbyte };

	if (sizeof(tap_data) != fwrite(tap_data, 1, sizeof(tap_data), FP_tapout)) {
		fclose(FP_tapout);
		Error("Write error (disk full?)", NULL, FATAL);
	}
}